

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O1

void av1_encode_dv(aom_writer *w,MV *mv,MV *ref,nmv_context *mvctx)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  short sVar11;
  short sVar12;
  
  sVar1 = mv->row;
  sVar2 = mv->col;
  sVar3 = ref->row;
  sVar4 = ref->col;
  sVar11 = sVar1 - sVar3;
  sVar12 = sVar2 - sVar4;
  bVar8 = (sVar11 != 0) * '\x02' | sVar12 != 0;
  od_ec_encode_cdf_q15(&w->ec,(uint)bVar8,mvctx->joints_cdf,4);
  if (w->allow_update_cdf != '\0') {
    uVar5 = mvctx->joints_cdf[4];
    bVar9 = (char)(uVar5 >> 4) + 5;
    uVar10 = 0;
    do {
      uVar6 = mvctx->joints_cdf[uVar10];
      if (uVar10 < bVar8) {
        sVar7 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar9 & 0x1f));
      }
      else {
        sVar7 = -(uVar6 >> (bVar9 & 0x1f));
      }
      mvctx->joints_cdf[uVar10] = sVar7 + uVar6;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
    mvctx->joints_cdf[4] = mvctx->joints_cdf[4] + (ushort)(uVar5 < 0x20);
  }
  if (sVar1 != sVar3) {
    encode_mv_component(w,(int)sVar11,mvctx->comps,-1);
  }
  if (sVar2 != sVar4) {
    encode_mv_component(w,(int)sVar12,mvctx->comps + 1,-1);
    return;
  }
  return;
}

Assistant:

void av1_encode_dv(aom_writer *w, const MV *mv, const MV *ref,
                   nmv_context *mvctx) {
  // DV and ref DV should not have sub-pel.
  assert((mv->col & 7) == 0);
  assert((mv->row & 7) == 0);
  assert((ref->col & 7) == 0);
  assert((ref->row & 7) == 0);
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);

  aom_write_symbol(w, j, mvctx->joints_cdf, MV_JOINTS);
  if (mv_joint_vertical(j))
    encode_mv_component(w, diff.row, &mvctx->comps[0], MV_SUBPEL_NONE);

  if (mv_joint_horizontal(j))
    encode_mv_component(w, diff.col, &mvctx->comps[1], MV_SUBPEL_NONE);
}